

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

nifti_image * nifti_copy_nim_info(nifti_image *src)

{
  char *pcVar1;
  nifti_image *dest;
  nifti_image *src_local;
  
  src_local = (nifti_image *)calloc(1,0x2b8);
  if (src_local == (nifti_image *)0x0) {
    fprintf(_stderr,"** NCNI: failed to alloc nifti_image\n");
    src_local = (nifti_image *)0x0;
  }
  else {
    memcpy(src_local,src,0x2b8);
    if (src->fname != (char *)0x0) {
      pcVar1 = nifti_strdup(src->fname);
      src_local->fname = pcVar1;
    }
    if (src->iname != (char *)0x0) {
      pcVar1 = nifti_strdup(src->iname);
      src_local->iname = pcVar1;
    }
    src_local->num_ext = 0;
    src_local->ext_list = (nifti1_extension *)0x0;
    nifti_copy_extensions(src_local,src);
    src_local->data = (void *)0x0;
  }
  return src_local;
}

Assistant:

nifti_image * nifti_copy_nim_info(const nifti_image * src)
{
  nifti_image *dest;
  dest = (nifti_image *)calloc(1,sizeof(nifti_image));
  if( !dest ){
     fprintf(stderr,"** NCNI: failed to alloc nifti_image\n");
     return NULL;
  }
  memcpy(dest, src, sizeof(nifti_image));
  if( src->fname ) dest->fname = nifti_strdup(src->fname);
  if( src->iname ) dest->iname = nifti_strdup(src->iname);
  dest->num_ext = 0;
  dest->ext_list = NULL;
  /* errors will be printed in NCE(), continue in either case */
  (void)nifti_copy_extensions(dest, src);

  dest->data = NULL;

  return dest;
}